

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TripWire.hpp
# Opt level: O3

vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_> *
gmlc::concurrency::make_triplines
          (vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
           *__return_storage_ptr__,int count)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  atomic<bool> *__tmp;
  vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
  *__range2;
  shared_ptr<std::atomic<bool>_> *line;
  pointer psVar3;
  allocator_type local_29;
  
  std::
  vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
  ::vector(__return_storage_ptr__,(long)count,&local_29);
  psVar1 = (__return_storage_ptr__->
           super__Vector_base<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (__return_storage_ptr__->
                super__Vector_base<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016a360;
    *(undefined1 *)&p_Var2[1]._vptr__Sp_counted_base = 0;
    (psVar3->super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)(p_Var2 + 1);
    this = (psVar3->super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
    (psVar3->super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         p_Var2;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<TriplineType> make_triplines(int count)
{
    std::vector<TriplineType> lines(count);
    for (auto& line : lines) {
        line = std::make_shared<std::atomic<bool>>(false);
    }
    return lines;
}